

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV3RotAnimationBlock(Parser *this,Animation *anim)

{
  byte bVar1;
  pointer paVar2;
  aiVector3t<float> axis;
  bool bVar3;
  bool bVar4;
  byte *pbVar5;
  int iVar6;
  ai_real f;
  uint iIndex;
  undefined8 local_58;
  float local_50;
  aiQuatKey local_48;
  
  pbVar5 = (byte *)this->filePtr;
  iVar6 = 0;
  do {
    if (*pbVar5 == 0x2a) {
      this->filePtr = (char *)(pbVar5 + 1);
      bVar3 = TokenMatch<char_const>(&this->filePtr,"CONTROL_ROT_SAMPLE",0x12);
      if (bVar3) {
        anim->mRotationType = TRACK;
      }
      bVar4 = TokenMatch<char_const>(&this->filePtr,"CONTROL_BEZIER_ROT_KEY",0x16);
      if (bVar4) {
        anim->mRotationType = BEZIER;
        bVar3 = true;
      }
      bVar4 = TokenMatch<char_const>(&this->filePtr,"CONTROL_TCB_ROT_KEY",0x13);
      if (bVar4) {
        anim->mRotationType = TCB;
      }
      else if (bVar3 == false) goto LAB_003d33b3;
      local_48.mTime = 0.0;
      local_48.mValue.w = 1.0;
      local_48.mValue.x = 0.0;
      local_48.mValue.y = 0.0;
      local_48.mValue.z = 0.0;
      std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::emplace_back<aiQuatKey>
                (&anim->akeyRotations,&local_48);
      paVar2 = (anim->akeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      local_58 = 0;
      local_50 = 0.0;
      ParseLV4MeshFloatTriple(this,(ai_real *)&local_58,&iIndex);
      ParseLV4MeshFloat(this,&f);
      paVar2[-1].mTime = (double)iIndex;
      axis.z = local_50;
      axis.x = (float)(undefined4)local_58;
      axis.y = (float)local_58._4_4_;
      aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)&local_48,axis,f);
      *(double *)&paVar2[-1].mValue = local_48.mTime;
      paVar2[-1].mValue.y = local_48.mValue.w;
      paVar2[-1].mValue.z = local_48.mValue.x;
    }
LAB_003d33b3:
    pbVar5 = (byte *)this->filePtr;
    bVar1 = *pbVar5;
    if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
      if (this->bLastWasEndLine != false) goto LAB_003d33f3;
      this->iLineNumber = this->iLineNumber + 1;
      bVar3 = true;
    }
    else {
      if (bVar1 == 0x7b) {
        iVar6 = iVar6 + 1;
      }
      else if (bVar1 == 0x7d) {
        iVar6 = iVar6 + -1;
        if (iVar6 == 0) {
          this->filePtr = (char *)(pbVar5 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else if (bVar1 == 0) {
        LogError(this,
                 "Encountered unexpected EOL while parsing a *CONTROL_ROT_TRACK chunk (Level 3)");
      }
LAB_003d33f3:
      bVar3 = false;
    }
    this->bLastWasEndLine = bVar3;
    pbVar5 = pbVar5 + 1;
    this->filePtr = (char *)pbVar5;
  } while( true );
}

Assistant:

void Parser::ParseLV3RotAnimationBlock(ASE::Animation& anim)
{
    AI_ASE_PARSER_INIT();
    unsigned int iIndex;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            bool b = false;

            // For the moment we're just reading the  floats -
            // we ignore the additional information for bezier's and TCBs

            // simple scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_ROT_SAMPLE" ,18))
            {
                b = true;
                anim.mRotationType = ASE::Animation::TRACK;
            }

            // Bezier scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_BEZIER_ROT_KEY" ,22))
            {
                b = true;
                anim.mRotationType = ASE::Animation::BEZIER;
            }
            // TCB scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_TCB_ROT_KEY" ,19))
            {
                b = true;
                anim.mRotationType = ASE::Animation::TCB;
            }
            if (b)
            {
                anim.akeyRotations.push_back(aiQuatKey());
                aiQuatKey& key = anim.akeyRotations.back();
                aiVector3D v;ai_real f;
                ParseLV4MeshFloatTriple(&v.x,iIndex);
                ParseLV4MeshFloat(f);
                key.mTime = (double)iIndex;
                key.mValue = aiQuaternion(v,f);
            }
        }
        AI_ASE_HANDLE_SECTION("3","*CONTROL_ROT_TRACK");
    }
}